

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

int nghttp2_bufs_addb_hold(nghttp2_bufs *bufs,uint8_t b)

{
  int iVar1;
  
  iVar1 = bufs_ensure_addb(bufs);
  if (iVar1 == 0) {
    *(bufs->cur->buf).last = b;
  }
  return iVar1;
}

Assistant:

int nghttp2_bufs_addb_hold(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

  *bufs->cur->buf.last = b;

  return 0;
}